

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_generate_ttf_font_atlas
          (rf_image *__return_storage_ptr__,rf_ttf_font_info *font_info,int atlas_width,int padding,
          rf_glyph_info *glyphs,rf_int glyphs_count,rf_font_antialias antialias,unsigned_short *dst,
          rf_int dst_count,rf_allocator temp_allocator)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  byte bVar10;
  rf_source_location rVar11;
  rf_source_location rVar12;
  rf_allocator_args rVar13;
  undefined1 auVar14 [24];
  stbtt_vertex *psVar15;
  stbtt_fontinfo *font;
  int iVar16;
  uint uVar17;
  undefined4 extraout_EAX;
  int iVar18;
  uint uVar19;
  stbtt__active_edge *z_1;
  float *pfVar20;
  stbtt__point *points;
  ulong uVar21;
  stbtt__edge *psVar22;
  char **scanline;
  stbtt__active_edge *psVar23;
  stbtt__active_edge *psVar24;
  char **ppcVar25;
  char **ppcVar26;
  stbtt__active_edge *psVar27;
  long lVar28;
  bool bVar29;
  undefined4 in_register_0000000c;
  rf_int rVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  bool bVar34;
  int iVar35;
  undefined8 *puVar36;
  stbtt__edge *psVar37;
  long lVar38;
  byte bVar39;
  stbtt__edge *psVar40;
  ulong uVar41;
  stbtt__active_edge *psVar42;
  int iVar43;
  int iVar44;
  ulong uVar45;
  rf_glyph_info *prVar46;
  stbtt__active_edge *z;
  long *in_FS_OFFSET;
  bool bVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  float in_XMM2_Da;
  float fVar52;
  float fVar53;
  float in_XMM3_Da;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float y0;
  int iy0;
  int ix0;
  stbtt__active_edge *active;
  stbtt_vertex *vertices;
  stbtt_fontinfo *stbtt_ctx;
  float scanline_data [129];
  int local_4ac;
  int local_4a0;
  uint local_49c;
  stbtt__active_edge *local_498;
  char *pcStack_490;
  ulong local_488;
  char **local_480;
  int local_474;
  char **local_470;
  char *pcStack_468;
  ulong local_460;
  uint local_458;
  int local_454;
  int local_450;
  float local_44c;
  rf_glyph_info *local_448;
  stbtt__active_edge *local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  stbtt__point *local_410;
  int local_404;
  char **local_400;
  undefined8 *local_3f8;
  stbtt__point *local_3f0;
  char *pcStack_3e8;
  ulong local_3e0;
  ulong local_3d8;
  stbtt__active_edge *local_3d0;
  ulong local_3c8;
  float *local_3c0;
  stbtt__edge *local_3b8;
  void *local_3b0;
  float local_3a4;
  float local_3a0;
  int local_39c;
  float local_398;
  float local_394;
  uint local_390;
  int local_38c;
  undefined1 local_388 [24];
  char *local_370;
  char *pcStack_368;
  ulong local_360;
  char *local_358;
  char *pcStack_350;
  ulong local_348;
  undefined8 local_340;
  rf_ttf_font_info *local_338;
  rf_int local_330;
  float *local_328;
  stbtt__edge *local_320;
  long local_318;
  stbtt_vertex *local_310;
  char *local_308;
  char *pcStack_300;
  ulong local_2f8;
  undefined1 local_2e8 [16];
  rf_image *local_2d8;
  long local_2d0;
  ulong local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  long local_2b0;
  ulong local_2a8;
  stbtt_fontinfo *local_2a0;
  void *local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  uint uStack_284;
  char *local_280;
  char *pcStack_278;
  undefined8 local_270;
  undefined8 local_268;
  ulong uStack_260;
  undefined4 local_258;
  uint uStack_254;
  char *local_250;
  char *pcStack_248;
  undefined8 local_240;
  char *local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  
  local_340 = CONCAT44(in_register_0000000c,padding);
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (((font_info != (rf_ttf_font_info *)0x0) && (font_info->valid == true)) &&
     ((long)(ulong)(uint)(atlas_width * atlas_width) <= dst_count && dst != (unsigned_short *)0x0))
  {
    uVar32 = 0;
    local_448 = glyphs;
    memset(dst,0,(ulong)(uint)(atlas_width * atlas_width * 2));
    if (0 < glyphs_count) {
      pfVar20 = &(local_448->field_0).rec.height;
      rVar30 = glyphs_count;
      uVar21 = uVar32;
      do {
        uVar32 = (ulong)(uint)(int)(pfVar20[-1] * *pfVar20);
        if ((int)(pfVar20[-1] * *pfVar20) < (int)uVar21) {
          uVar32 = uVar21;
        }
        pfVar20 = pfVar20 + 8;
        rVar30 = rVar30 + -1;
        uVar21 = uVar32;
      } while (rVar30 != 0);
    }
    local_250 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_248 = "rf_generate_ttf_font_atlas";
    local_240 = 0x5bc7;
    local_268 = 0;
    local_258 = 0;
    rVar11.proc_name = "rf_generate_ttf_font_atlas";
    rVar11.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar11.line_in_file = 0x5bc7;
    auVar14._8_8_ = (ulong)uStack_254 << 0x20;
    auVar14._0_8_ = uVar32;
    auVar14._16_8_ = 0;
    local_458 = atlas_width;
    uStack_260 = uVar32;
    local_3b0 = (*temp_allocator.allocator_proc)
                          (&temp_allocator,rVar11,RF_AM_ALLOC,(rf_allocator_args)(auVar14 << 0x40));
    if (local_3b0 != (void *)0x0) {
      puVar36 = (undefined8 *)(*in_FS_OFFSET + -0x430);
      in_FS_OFFSET[-0x86] = (long)temp_allocator.user_data;
      in_FS_OFFSET[-0x85] = (long)temp_allocator.allocator_proc;
      local_2d8 = __return_storage_ptr__;
      if (0 < glyphs_count) {
        local_2a0 = (stbtt_fontinfo *)&font_info->internal_stb_font_info;
        local_3a0 = (float)((int)local_340 * 2);
        local_2c8 = (ulong)local_458;
        local_3a4 = (float)(int)local_458;
        local_2d0 = local_2c8 << 0x20;
        local_474 = 2;
        iVar16 = 2;
        lVar28 = 0;
        local_3f8 = puVar36;
        local_338 = font_info;
        local_330 = glyphs_count;
        do {
          prVar46 = local_448;
          local_438 = ZEXT416((uint)local_338->scale_factor);
          local_404 = iVar16;
          local_318 = lVar28;
          iVar16 = stbtt_FindGlyphIndex
                             ((stbtt_fontinfo *)(local_338->internal_stb_font_info).data,
                              (local_338->internal_stb_font_info).index_map);
          font = local_2a0;
          uVar4 = *(undefined8 *)((long)&prVar46[lVar28].field_0 + 8);
          local_428._4_4_ = (int)(float)((ulong)uVar4 >> 0x20);
          local_428._0_4_ = (int)(float)uVar4;
          local_428._8_8_ = 0;
          uVar17 = stbtt_GetGlyphShape(local_2a0,iVar16,&local_310);
          stbtt_GetGlyphBitmapBoxSubpixel
                    (font,iVar16,(float)local_438._0_4_,(float)local_438._0_4_,in_XMM2_Da,in_XMM3_Da
                     ,&local_38c,(int *)&local_390,(int *)0x0,(int *)0x0);
          psVar15 = local_310;
          iVar16 = local_38c;
          auVar51._0_4_ = -(uint)(local_428._0_4_ == 0);
          auVar51._4_4_ = -(uint)(local_428._0_4_ == 0);
          auVar51._8_4_ = -(uint)(local_428._4_4_ == 0);
          auVar51._12_4_ = -(uint)(local_428._4_4_ == 0);
          iVar18 = movmskpd(extraout_EAX,auVar51);
          if ((iVar18 == 0) && (0 < (int)uVar17)) {
            local_3d8 = (ulong)local_390;
            local_480 = (char **)CONCAT44(local_480._4_4_,
                                          (0.35 / (float)local_438._0_4_) *
                                          (0.35 / (float)local_438._0_4_));
            lVar31 = 0;
            uVar19 = 0;
            do {
              uVar19 = uVar19 + ((&local_310->type)[lVar31] == '\x01');
              lVar31 = lVar31 + 0xe;
            } while ((ulong)uVar17 * 0xe != lVar31);
            if (uVar19 != 0) {
              local_238 = 
              "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
              ;
              uStack_230._0_4_ = 0x17d1c9;
              uStack_230._4_4_ = 0;
              local_228 = 0x55ac;
              local_498 = (stbtt__active_edge *)0x0;
              uVar32 = (ulong)uVar19;
              pcStack_490 = (char *)(uVar32 * 4);
              local_488 = local_488 & 0xffffffff00000000;
              local_440 = (stbtt__active_edge *)(*(code *)in_FS_OFFSET[-0x85])(puVar36,1);
              if (local_440 != (stbtt__active_edge *)0x0) {
                bVar29 = false;
                local_4ac = 0;
                points = (stbtt__point *)0x0;
                iVar18 = 0;
                bVar47 = true;
                do {
                  bVar34 = bVar47;
                  if (bVar29) {
                    local_470 = (char **)0x17a80c;
                    pcStack_468 = "stbtt_FlattenCurves";
                    local_460 = 0x55b7;
                    local_3f0 = (stbtt__point *)0x0;
                    pcStack_3e8 = (char *)((long)iVar18 << 3);
                    local_3e0 = local_3e0 & 0xffffffff00000000;
                    points = (stbtt__point *)(*(code *)in_FS_OFFSET[-0x85])(puVar36,1);
                    if (points == (stbtt__point *)0x0) {
                      local_358 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ;
                      pcStack_350 = "stbtt_FlattenCurves";
                      local_348 = 0x55e2;
                      local_308 = (char *)0x0;
                      pcStack_300 = (char *)0x0;
                      local_2f8 = local_2f8 & 0xffffffff00000000;
                      (*(code *)in_FS_OFFSET[-0x85])(puVar36,3);
                      local_370 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ;
                      pcStack_368 = "stbtt_FlattenCurves";
                      local_360 = 0x55e3;
                      local_388._0_8_ = local_440;
                      local_388._8_4_ = 0.0;
                      local_388._12_4_ = 0.0;
                      local_388._16_4_ = 0.0;
                      goto LAB_001348e0;
                    }
                  }
                  local_4a0 = 0;
                  fVar48 = 0.0;
                  fVar49 = 0.0;
                  uVar19 = 0xffffffff;
                  lVar31 = 0;
                  local_410 = points;
                  do {
                    switch((&psVar15->type)[lVar31]) {
                    case '\x01':
                      if (-1 < (int)uVar19) {
                        *(int *)((long)&local_440->next + (ulong)uVar19 * 4) = local_4a0 - local_4ac
                        ;
                      }
                      uVar19 = uVar19 + 1;
                      auVar51 = ZEXT416(*(uint *)((long)&psVar15->x + lVar31));
                      auVar51 = pshuflw(auVar51,auVar51,0x60);
                      fVar48 = (float)(auVar51._0_4_ >> 0x10);
                      fVar49 = (float)(auVar51._4_4_ >> 0x10);
                      if (points != (stbtt__point *)0x0) {
                        points[local_4a0].x = fVar48;
                        points[local_4a0].y = fVar49;
                      }
                      local_4ac = local_4a0;
                      local_4a0 = local_4a0 + 1;
                      break;
                    case '\x02':
                      lVar38 = (long)local_4a0;
                      local_4a0 = local_4a0 + 1;
                      auVar51 = ZEXT416(*(uint *)((long)&psVar15->x + lVar31));
                      auVar51 = pshuflw(auVar51,auVar51,0x60);
                      fVar48 = (float)(auVar51._0_4_ >> 0x10);
                      fVar49 = (float)(auVar51._4_4_ >> 0x10);
                      if (points != (stbtt__point *)0x0) {
                        points[lVar38].x = fVar48;
                        points[lVar38].y = fVar49;
                      }
                      break;
                    case '\x03':
                      stbtt__tesselate_curve
                                (points,&local_4a0,fVar48,fVar49,
                                 (float)(int)*(short *)((long)&psVar15->cx + lVar31),
                                 (float)(int)*(short *)((long)&psVar15->cy + lVar31),
                                 (float)(int)*(short *)((long)&psVar15->x + lVar31),
                                 (float)(int)*(short *)((long)&psVar15->y + lVar31),local_480._0_4_,
                                 0);
                      goto LAB_00133734;
                    case '\x04':
                      stbtt__tesselate_cubic
                                (points,&local_4a0,fVar48,fVar49,
                                 (float)(int)*(short *)((long)&psVar15->cx + lVar31),
                                 (float)(int)*(short *)((long)&psVar15->cy + lVar31),
                                 (float)(int)*(short *)((long)&psVar15->cx1 + lVar31),
                                 (float)(int)*(short *)((long)&psVar15->cy1 + lVar31),
                                 (float)(int)*(short *)((long)&psVar15->x + lVar31),
                                 (float)(int)*(short *)((long)&psVar15->y + lVar31),local_480._0_4_,
                                 0);
LAB_00133734:
                      auVar51 = ZEXT416(*(uint *)((long)&psVar15->x + lVar31));
                      auVar51 = pshuflw(auVar51,auVar51,0x60);
                      fVar48 = (float)(auVar51._0_4_ >> 0x10);
                      fVar49 = (float)(auVar51._4_4_ >> 0x10);
                      points = local_410;
                    }
                    puVar36 = local_3f8;
                    psVar42 = local_440;
                    lVar31 = lVar31 + 0xe;
                  } while ((ulong)uVar17 * 0xe != lVar31);
                  *(int *)((long)&local_440->next + (long)(int)uVar19 * 4) = local_4a0 - local_4ac;
                  bVar29 = true;
                  iVar18 = local_4a0;
                  bVar47 = false;
                } while (bVar34);
                if (points != (stbtt__point *)0x0) {
                  uVar21 = 0;
                  lVar31 = 0;
                  do {
                    lVar31 = (long)(int)lVar31 +
                             (long)(int)*(float *)((long)&local_440->next + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar32 != uVar21);
                  pcStack_368 = (char *)(lVar31 * 0x14 + 0x14);
                  local_308 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                  ;
                  pcStack_300 = "stbtt__rasterize";
                  local_2f8 = 0x552f;
                  local_370 = (char *)0x0;
                  local_360 = local_360 & 0xffffffff00000000;
                  psVar22 = (stbtt__edge *)(*(code *)in_FS_OFFSET[-0x85])(local_3f8,1);
                  local_3b8 = psVar22;
                  if (psVar22 != (stbtt__edge *)0x0) {
                    uVar21 = 0;
                    uVar17 = 0;
                    iVar18 = 0;
                    do {
                      fVar48 = *(float *)((long)&psVar42->next + uVar21 * 4);
                      if (0 < (int)fVar48) {
                        uVar45 = (ulong)((int)fVar48 - 1);
                        uVar41 = 0;
                        fVar49 = fVar48;
                        do {
                          iVar43 = (int)uVar45;
                          fVar53 = local_410[(long)iVar18 + (long)iVar43].y;
                          fVar50 = local_410[(long)iVar18 + uVar41].y;
                          if ((fVar53 != fVar50) || (NAN(fVar53) || NAN(fVar50))) {
                            iVar44 = (int)uVar41;
                            iVar35 = iVar43;
                            if (fVar53 <= fVar50) {
                              iVar35 = iVar44;
                              iVar44 = iVar43;
                            }
                            psVar22[(int)uVar17].invert = (uint)(fVar50 < fVar53);
                            sVar5 = local_410[(long)iVar18 + (long)iVar35];
                            sVar6 = local_410[(long)iVar18 + (long)iVar44];
                            psVar37 = psVar22 + (int)uVar17;
                            psVar37->x0 = sVar5.x * (float)local_438._0_4_ + 0.0;
                            psVar37->y0 = sVar5.y * -(float)local_438._0_4_ + 0.0;
                            psVar37->x1 = sVar6.x * (float)local_438._0_4_ + 0.0;
                            psVar37->y1 = sVar6.y * -(float)local_438._0_4_ + 0.0;
                            uVar17 = uVar17 + 1;
                            fVar49 = *(float *)((long)&local_440->next + uVar21 * 4);
                            puVar36 = local_3f8;
                            psVar42 = local_440;
                          }
                          uVar45 = uVar41 & 0xffffffff;
                          uVar41 = uVar41 + 1;
                        } while ((long)uVar41 < (long)(int)fVar49);
                      }
                      iVar18 = iVar18 + (int)fVar48;
                      uVar21 = uVar21 + 1;
                    } while (uVar21 != uVar32);
                    stbtt__sort_edges_quicksort(psVar22,uVar17);
                    if (1 < (int)uVar17) {
                      uVar32 = 1;
                      lVar31 = 2;
                      psVar37 = psVar22;
                      do {
                        uVar1 = psVar22[uVar32].x0;
                        uVar7 = psVar22[uVar32].y0;
                        uStack_230._0_4_ = psVar22[uVar32].invert;
                        local_238 = *(char **)&psVar22[uVar32].x1;
                        lVar38 = lVar31;
                        psVar40 = psVar37;
                        do {
                          if (psVar40->y0 <= (float)uVar7) {
                            uVar19 = (int)lVar38 - 1;
                            goto LAB_00133a28;
                          }
                          psVar40[1].invert = psVar40->invert;
                          fVar48 = psVar40->y0;
                          fVar49 = psVar40->x1;
                          fVar53 = psVar40->y1;
                          psVar40[1].x0 = psVar40->x0;
                          psVar40[1].y0 = fVar48;
                          psVar40[1].x1 = fVar49;
                          psVar40[1].y1 = fVar53;
                          lVar38 = lVar38 + -1;
                          psVar40 = psVar40 + -1;
                        } while (1 < lVar38);
                        uVar19 = 0;
LAB_00133a28:
                        if (uVar32 != uVar19) {
                          psVar22[(int)uVar19].x0 = (float)uVar1;
                          psVar22[(int)uVar19].y0 = (float)uVar7;
                          *(char **)&psVar22[(int)uVar19].x1 = local_238;
                          psVar22[(int)uVar19].invert = (int)uStack_230;
                        }
                        uVar32 = uVar32 + 1;
                        lVar31 = lVar31 + 1;
                        psVar37 = psVar37 + 1;
                      } while (uVar32 != uVar17);
                    }
                    local_388._0_8_ = (stbtt__active_edge *)0x0;
                    scanline = &local_238;
                    local_49c = local_428._0_4_;
                    if (0x40 < (int)local_428._0_4_) {
                      local_3f0 = (stbtt__point *)0x17a80c;
                      pcStack_3e8 = "stbtt__rasterize_sorted_edges";
                      local_3e0 = 0x5465;
                      local_358 = (char *)0x0;
                      pcStack_350 = (char *)((ulong)(uint)local_428._0_4_ * 8 + 4);
                      local_348 = local_348 & 0xffffffff00000000;
                      scanline = (char **)(*(code *)in_FS_OFFSET[-0x85])(puVar36,1);
                    }
                    local_2a8 = (ulong)(uint)local_428._4_4_;
                    psVar22[(int)uVar17].y0 = (float)((int)local_3d8 + local_428._4_4_) + 1.0;
                    ppcVar25 = local_470;
                    if (0 < (int)local_428._4_4_) {
                      local_398 = (float)iVar16;
                      local_2b0 = (long)(int)local_49c;
                      local_3c0 = (float *)((long)scanline + local_2b0 * 4);
                      local_328 = local_3c0 + 1;
                      local_2b8 = local_2b0 * 4;
                      local_2c0 = local_2b0 * 4 + 4;
                      local_44c = (float)(int)local_49c;
                      local_3c8 = 0;
                      local_450 = 0;
                      local_400 = (char **)0x0;
                      local_454 = 0;
                      local_3d0 = (stbtt__active_edge *)0x0;
                      uVar32 = local_3d8;
                      psVar42 = (stbtt__active_edge *)0x0;
                      local_320 = psVar22;
                      do {
                        local_39c = (int)uVar32;
                        fVar48 = (float)local_39c;
                        fVar49 = fVar48 + 1.0;
                        memset(scanline,0,local_2b8);
                        memset(local_3c0,0,local_2c0);
                        psVar27 = local_3d0;
                        if (psVar42 != (stbtt__active_edge *)0x0) {
                          psVar23 = (stbtt__active_edge *)local_388;
                          do {
                            psVar24 = psVar42;
                            if (psVar42->ey <= fVar48) {
                              psVar23->next = psVar42->next;
                              psVar42->direction = 0.0;
                              psVar42->next = psVar27;
                              psVar24 = psVar23;
                              psVar27 = psVar42;
                            }
                            psVar42 = psVar24->next;
                            psVar23 = psVar24;
                          } while (psVar42 != (stbtt__active_edge *)0x0);
                        }
                        fVar53 = local_320->y0;
                        ppcVar25 = local_400;
                        psVar22 = local_320;
                        iVar16 = local_454;
                        if (fVar53 <= fVar49) {
                          iVar18 = (int)local_3d8;
                          bVar47 = local_450 == 0;
                          do {
                            if ((fVar53 != psVar22->y1) || (NAN(fVar53) || NAN(psVar22->y1))) {
                              if (psVar27 == (stbtt__active_edge *)0x0) {
                                if (iVar16 == 0) {
                                  local_498 = (stbtt__active_edge *)0x17a80c;
                                  pcStack_490 = "stbtt__hheap_alloc";
                                  local_488 = 0x529c;
                                  local_470 = (char **)0x0;
                                  pcStack_468 = (char *)0x6408;
                                  local_460 = local_460 & 0xffffffff00000000;
                                  ppcVar26 = (char **)(*(code *)in_FS_OFFSET[-0x85])(local_3f8,1);
                                  if (ppcVar26 == (char **)0x0) {
                                    psVar27 = (stbtt__active_edge *)0x0;
                                    iVar16 = 0;
                                    goto LAB_0013450c;
                                  }
                                  *ppcVar26 = (char *)ppcVar25;
                                  iVar16 = 799;
                                }
                                else {
                                  iVar16 = iVar16 + -1;
                                  ppcVar26 = ppcVar25;
                                }
                                psVar27 = (stbtt__active_edge *)(ppcVar26 + (long)iVar16 * 4 + 1);
                                psVar42 = (stbtt__active_edge *)0x0;
                                ppcVar25 = ppcVar26;
                              }
                              else {
                                psVar42 = psVar27->next;
                              }
                              uVar2 = psVar22->x0;
                              uVar8 = psVar22->y0;
                              uVar3 = psVar22->x1;
                              uVar9 = psVar22->y1;
                              fVar53 = ((float)uVar3 - (float)uVar2) / ((float)uVar9 - (float)uVar8)
                              ;
                              psVar27->fdx = fVar53;
                              psVar27->fdy = (float)(-(uint)(fVar53 != 0.0) & (uint)(1.0 / fVar53));
                              psVar27->fx = ((fVar48 - (float)uVar8) * fVar53 + (float)uVar2) -
                                            local_398;
                              psVar27->direction =
                                   *(float *)(&DAT_00177a78 + (ulong)(psVar22->invert == 0) * 4);
                              psVar27->sy = (float)uVar8;
                              psVar27->ey = (float)uVar9;
                              psVar27->next = (stbtt__active_edge *)0x0;
                              if ((float)uVar9 < fVar48 && (bVar47 && iVar18 != 0)) {
                                psVar27->ey = fVar48;
                              }
                              psVar27->next = (stbtt__active_edge *)local_388._0_8_;
                              local_388._0_8_ = psVar27;
                              psVar27 = psVar42;
                            }
LAB_0013450c:
                            fVar53 = psVar22[1].y0;
                            psVar22 = psVar22 + 1;
                          } while (fVar53 <= fVar49);
                        }
                        local_454 = iVar16;
                        local_320 = psVar22;
                        local_400 = ppcVar25;
                        local_3d0 = psVar27;
                        for (psVar42 = (stbtt__active_edge *)local_388._0_8_; puVar36 = local_3f8,
                            psVar42 != (stbtt__active_edge *)0x0; psVar42 = psVar42->next) {
                          fVar50 = psVar42->fx;
                          fVar53 = psVar42->fdx;
                          if ((fVar53 != 0.0) || (NAN(fVar53))) {
                            fVar58 = fVar53 + fVar50;
                            fVar59 = psVar42->sy;
                            fVar52 = (float)(~-(uint)(fVar48 < fVar59) & (uint)fVar50 |
                                            (uint)((fVar59 - fVar48) * fVar53 + fVar50) &
                                            -(uint)(fVar48 < fVar59));
                            if (0.0 <= fVar52) {
                              fVar54 = psVar42->ey;
                              fVar57 = (float)(-(uint)(fVar54 < fVar49) &
                                               (uint)((fVar54 - fVar48) * fVar53 + fVar50) |
                                              ~-(uint)(fVar54 < fVar49) & (uint)fVar58);
                              if (((0.0 <= fVar57) && (fVar52 < local_44c)) && (fVar57 < local_44c))
                              {
                                if (fVar59 <= fVar48) {
                                  fVar59 = fVar48;
                                }
                                iVar16 = (int)fVar52;
                                if (fVar49 <= fVar54) {
                                  fVar54 = fVar49;
                                }
                                iVar18 = (int)fVar57;
                                if (iVar16 == iVar18) {
                                  lVar31 = (long)iVar16;
                                  *(float *)((long)scanline + lVar31 * 4) =
                                       (((fVar57 - (float)iVar16) + (fVar52 - (float)iVar16)) * -0.5
                                       + 1.0) * psVar42->direction * (fVar54 - fVar59) +
                                       *(float *)((long)scanline + lVar31 * 4);
                                  fVar50 = (fVar54 - fVar59) * psVar42->direction;
                                }
                                else {
                                  fVar53 = psVar42->fdy;
                                  fVar56 = fVar57;
                                  iVar43 = iVar16;
                                  if (fVar57 < fVar52) {
                                    fVar55 = fVar48 - fVar59;
                                    fVar59 = (fVar48 - fVar54) + fVar49;
                                    fVar53 = -fVar53;
                                    fVar56 = fVar52;
                                    fVar50 = fVar58;
                                    iVar43 = iVar18;
                                    iVar18 = iVar16;
                                    fVar54 = fVar55 + fVar49;
                                    fVar52 = fVar57;
                                  }
                                  iVar16 = iVar43 + 1;
                                  fVar57 = ((float)iVar16 - fVar50) * fVar53 + fVar48;
                                  fVar50 = psVar42->direction;
                                  fVar58 = (fVar57 - fVar59) * fVar50;
                                  lVar31 = (long)iVar43;
                                  *(float *)((long)scanline + lVar31 * 4) =
                                       (((fVar52 - (float)iVar43) + 1.0) * -0.5 + 1.0) * fVar58 +
                                       *(float *)((long)scanline + lVar31 * 4);
                                  if (iVar18 - iVar16 != 0 && iVar16 <= iVar18) {
                                    do {
                                      *(float *)((long)scanline + (lVar31 + 1) * 4) =
                                           fVar53 * fVar50 * 0.5 + fVar58 +
                                           *(float *)((long)scanline + (lVar31 + 1) * 4);
                                      fVar58 = fVar58 + fVar53 * fVar50;
                                      lVar31 = lVar31 + 1;
                                    } while (iVar18 + -1 != (int)lVar31);
                                  }
                                  lVar31 = (long)iVar18;
                                  *(float *)((long)scanline + lVar31 * 4) =
                                       (fVar54 - (fVar53 * (float)(iVar18 - iVar16) + fVar57)) *
                                       (((fVar56 - (float)iVar18) + 0.0) * -0.5 + 1.0) * fVar50 +
                                       fVar58 + *(float *)((long)scanline + lVar31 * 4);
                                  fVar50 = (fVar54 - fVar59) * fVar50;
                                }
                                local_328[lVar31] = fVar50 + local_328[lVar31];
                                goto LAB_00134267;
                              }
                            }
                            if (0 < (int)local_49c) {
                              local_2e8 = ZEXT416((uint)fVar50);
                              local_428 = ZEXT416((uint)fVar58);
                              local_394 = fVar53;
                              uVar17 = 0;
                              do {
                                fVar54 = (float)(int)uVar17;
                                uVar19 = uVar17 + 1;
                                fVar52 = (float)(int)uVar19;
                                fVar53 = (fVar54 - fVar50) / local_394 + fVar48;
                                fVar59 = (fVar52 - fVar50) / local_394 + fVar48;
                                local_480 = (char **)CONCAT44(local_480._4_4_,fVar53);
                                if ((fVar54 <= fVar50) || (fVar58 <= fVar52)) {
                                  if ((fVar58 < fVar54) && (fVar52 < fVar50)) {
                                    local_438._0_4_ = fVar59;
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar17,psVar42,fVar50,fVar48,fVar52
                                               ,fVar59);
                                    fVar57 = (float)local_438._0_4_;
                                    fVar50 = fVar52;
                                    fVar53 = local_480._0_4_;
LAB_00133ff6:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar17,psVar42,fVar50,fVar57,fVar54
                                               ,fVar53);
                                    fVar53 = local_480._0_4_;
                                    fVar50 = fVar54;
                                    goto LAB_00134010;
                                  }
                                  fVar57 = fVar48;
                                  if (((fVar50 < fVar54) && (fVar54 < fVar58)) ||
                                     ((fVar58 < fVar54 && (fVar54 < fVar50)))) goto LAB_00133ff6;
                                  if (((fVar50 < fVar52) && (fVar52 < fVar58)) ||
                                     ((fVar53 = fVar48, fVar58 < fVar52 && (fVar52 < fVar50)))) {
                                    local_438._0_4_ = fVar59;
                                    fVar53 = fVar48;
                                    goto LAB_00133f5b;
                                  }
                                }
                                else {
                                  local_438._0_4_ = fVar59;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar17,psVar42,fVar50,fVar48,fVar54,
                                             fVar53);
                                  fVar53 = local_480._0_4_;
                                  fVar50 = fVar54;
                                  fVar59 = (float)local_438._0_4_;
LAB_00133f5b:
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar17,psVar42,fVar50,fVar53,fVar52,
                                             fVar59);
                                  fVar53 = (float)local_438._0_4_;
                                  fVar50 = fVar52;
LAB_00134010:
                                  fVar58 = (float)local_428._0_4_;
                                }
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,uVar17,psVar42,fVar50,fVar53,fVar58,
                                           fVar49);
                                fVar50 = (float)local_2e8._0_4_;
                                fVar58 = (float)local_428._0_4_;
                                uVar17 = uVar19;
                              } while (local_49c != uVar19);
                            }
                          }
                          else if (fVar50 < local_44c) {
                            if (0.0 <= fVar50) {
                              local_2e8 = ZEXT416((uint)fVar50);
                              stbtt__handle_clipped_edge
                                        ((float *)scanline,(int)fVar50,psVar42,fVar50,fVar48,fVar50,
                                         fVar49);
                              iVar16 = (int)fVar50 + 1;
                              fVar50 = (float)local_2e8._0_4_;
                            }
                            else {
                              iVar16 = 0;
                            }
                            stbtt__handle_clipped_edge
                                      (local_3c0,iVar16,psVar42,fVar50,fVar48,fVar50,fVar49);
                          }
LAB_00134267:
                        }
                        psVar42 = (stbtt__active_edge *)local_388._0_8_;
                        if (0 < (int)local_49c) {
                          fVar48 = 0.0;
                          ppcVar25 = scanline;
                          uVar32 = local_3c8;
                          lVar31 = local_2b0;
                          do {
                            fVar48 = fVar48 + *(float *)((long)ppcVar25 + local_2b0 * 4);
                            iVar16 = (int)(ABS(*(float *)ppcVar25 + fVar48) * 255.0 + 0.5);
                            if (0xfe < iVar16) {
                              iVar16 = 0xff;
                            }
                            *(char *)((long)local_3b0 + (long)(int)uVar32) = (char)iVar16;
                            uVar32 = (ulong)((int)uVar32 + 1);
                            ppcVar25 = (char **)((long)ppcVar25 + 4);
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                        for (; psVar42 != (stbtt__active_edge *)0x0; psVar42 = psVar42->next) {
                          psVar42->fx = psVar42->fdx + psVar42->fx;
                        }
                        uVar32 = (ulong)(local_39c + 1);
                        local_450 = local_450 + 1;
                        local_3c8 = (ulong)((int)local_3c8 + local_49c);
                        psVar42 = (stbtt__active_edge *)local_388._0_8_;
                        ppcVar25 = local_470;
                        ppcVar26 = local_400;
                      } while (local_450 != (int)local_2a8);
                      while (local_470 = ppcVar26, local_470 != (char **)0x0) {
                        local_480 = (char **)*local_470;
                        local_498 = (stbtt__active_edge *)0x17a80c;
                        pcStack_490 = "stbtt__hheap_cleanup";
                        local_488 = 0x52b3;
                        pcStack_468 = (char *)0x0;
                        local_460 = local_460 & 0xffffffff00000000;
                        (*(code *)in_FS_OFFSET[-0x85])(puVar36,3);
                        ppcVar25 = local_470;
                        ppcVar26 = local_480;
                      }
                    }
                    local_470 = ppcVar25;
                    if (scanline != &local_238) {
                      local_498 = (stbtt__active_edge *)0x17a80c;
                      pcStack_490 = "stbtt__rasterize_sorted_edges";
                      local_488 = 0x54b9;
                      pcStack_468 = (char *)0x0;
                      local_460 = local_460 & 0xffffffff00000000;
                      local_470 = scanline;
                      (*(code *)in_FS_OFFSET[-0x85])(puVar36,3);
                    }
                    local_238 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                    ;
                    uStack_230 = "stbtt__rasterize";
                    local_228 = 0x5552;
                    local_498 = (stbtt__active_edge *)local_3b8;
                    pcStack_490 = (char *)0x0;
                    local_488 = local_488 & 0xffffffff00000000;
                    (*(code *)in_FS_OFFSET[-0x85])(puVar36,3);
                    psVar42 = local_440;
                  }
                  local_238 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                  ;
                  uStack_230._0_4_ = 0x17d1b9;
                  uStack_230._4_4_ = 0;
                  local_228 = 0x55f1;
                  pcStack_490 = (char *)0x0;
                  local_488 = local_488 & 0xffffffff00000000;
                  local_498 = psVar42;
                  (*(code *)in_FS_OFFSET[-0x85])(puVar36,3);
                  local_470 = (char **)0x17a80c;
                  pcStack_468 = "stbtt_Rasterize";
                  local_460 = 0x55f2;
                  local_3f0 = local_410;
                  pcStack_3e8 = (char *)0x0;
                  local_3e0 = local_3e0 & 0xffffffff00000000;
LAB_001348e0:
                  (*(code *)in_FS_OFFSET[-0x85])(puVar36,3);
                }
              }
            }
          }
          prVar46 = local_448 + lVar28;
          local_238 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          uStack_230 = "stbtt_MakeGlyphBitmapSubpixel";
          local_228 = 0x5638;
          local_498 = (stbtt__active_edge *)local_310;
          pcStack_490 = (char *)0x0;
          local_488 = local_488 & 0xffffffff00000000;
          (*(code *)in_FS_OFFSET[-0x85])(puVar36,3);
          fVar48 = (prVar46->field_0).rec.width;
          fVar49 = (prVar46->field_0).rec.height;
          if (0.0 < fVar49) {
            lVar28 = (ulong)(uint)((int)local_2c8 * local_404 + local_474) << 0x20;
            lVar31 = 0;
            do {
              if (0.0 < fVar48) {
                lVar33 = 1;
                lVar38 = lVar28;
                do {
                  bVar10 = *(byte *)((long)local_3b0 + lVar33 + -1 + (int)fVar48 * lVar31);
                  bVar39 = bVar10;
                  if (0x50 < bVar10) {
                    bVar39 = 0;
                  }
                  if (antialias != RF_FONT_NO_ANTIALIAS) {
                    bVar39 = bVar10;
                  }
                  *(undefined1 *)((long)dst + (lVar38 >> 0x1f)) = 0xff;
                  *(byte *)((long)dst + (lVar38 >> 0x1f) + 1) = bVar39;
                  fVar49 = (float)lVar33;
                  fVar48 = (prVar46->field_0).rec.width;
                  lVar33 = lVar33 + 1;
                  lVar38 = lVar38 + 0x100000000;
                } while (fVar49 < fVar48);
                fVar49 = (prVar46->field_0).rec.height;
              }
              lVar31 = lVar31 + 1;
              lVar28 = lVar28 + local_2d0;
            } while ((float)lVar31 < fVar49);
          }
          (prVar46->field_0).rec.x = (float)local_474;
          (prVar46->field_0).rec.y = (float)local_404;
          fVar49 = fVar48 + local_3a0 + (float)local_474;
          in_XMM2_Da = (local_3a4 - fVar48) - local_3a0;
          if (in_XMM2_Da <= (float)(int)fVar49) {
            local_474 = (int)local_340;
            iVar18 = local_338->font_size + local_474;
            iVar16 = local_404 + iVar18;
            if ((int)(local_458 - iVar18) < iVar16) break;
          }
          else {
            local_474 = (int)fVar49;
            iVar16 = local_404;
          }
          lVar28 = local_318 + 1;
          in_XMM3_Da = local_3a0;
        } while (lVar28 != local_330);
      }
      *puVar36 = 0;
      puVar36[1] = 0;
      local_2d8->data = dst;
      local_2d8->width = local_458;
      local_2d8->height = local_458;
      local_2d8->format = RF_UNCOMPRESSED_GRAY_ALPHA;
      local_2d8->valid = true;
      __return_storage_ptr__ = local_2d8;
    }
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_278 = "rf_generate_ttf_font_atlas";
    local_270 = 0x5c05;
    local_298 = local_3b0;
    uStack_290 = 0;
    local_288 = 0;
    rVar12.proc_name = "rf_generate_ttf_font_atlas";
    rVar12.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar12.line_in_file = 0x5c05;
    rVar13.size_to_allocate_or_reallocate = 0;
    rVar13.pointer_to_free_or_realloc = local_3b0;
    rVar13._16_8_ = (ulong)uStack_284 << 0x20;
    (*temp_allocator.allocator_proc)(&temp_allocator,rVar12,RF_AM_FREE,rVar13);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_generate_ttf_font_atlas(rf_ttf_font_info* font_info, int atlas_width, int padding, rf_glyph_info* glyphs, rf_int glyphs_count, rf_font_antialias antialias, unsigned short* dst, rf_int dst_count, rf_allocator temp_allocator)
{
    rf_image result = {0};

    if (font_info && font_info->valid)
    {
        int atlas_pixel_count = atlas_width * atlas_width;

        if (dst && dst_count >= atlas_pixel_count)
        {
            memset(dst, 0, atlas_pixel_count * 2);

            int largest_glyph_size = 0;
            for (rf_int i = 0; i < glyphs_count; i++)
            {
                int area = glyphs[i].width * glyphs[i].height;
                if (area > largest_glyph_size)
                {
                    largest_glyph_size = area;
                }
            }

            // Allocate a grayscale buffer large enough to store the largest glyph
            unsigned char* glyph_buffer = RF_ALLOC(temp_allocator, largest_glyph_size);

            // Use basic packing algorithm to generate the atlas
            if (glyph_buffer)
            {
                // We update these for every pixel in the loop
                int offset_x = RF_BUILTIN_FONT_PADDING;
                int offset_y = RF_BUILTIN_FONT_PADDING;

                // Set the allocator for stbtt
                RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
                {
                    // Using simple packaging, one char after another
                    for (rf_int i = 0; i < glyphs_count; i++)
                    {
                        // Extract these variables to shorter names
                        stbtt_fontinfo* stbtt_ctx = (stbtt_fontinfo*) &font_info->internal_stb_font_info;

                        // Get glyph bitmap
                        stbtt_MakeCodepointBitmap(stbtt_ctx, glyph_buffer, glyphs[i].width, glyphs[i].height, glyphs[i].width, font_info->scale_factor, font_info->scale_factor, glyphs[i].codepoint);

                        // Copy pixel data from fc.data to atlas
                        for (rf_int y = 0; y < glyphs[i].height; y++)
                        {
                            for (rf_int x = 0; x < glyphs[i].width; x++)
                            {
                                unsigned char glyph_pixel = glyph_buffer[y * ((int)glyphs[i].width) + x];
                                if (antialias == RF_FONT_NO_ANTIALIAS && glyph_pixel > RF_BITMAP_ALPHA_THRESHOLD) glyph_pixel = 0;

                                int dst_index = (offset_y + y) * atlas_width + (offset_x + x);
                                // dst is in RF_UNCOMPRESSED_GRAY_ALPHA which is 2 bytes
                                // for fonts we write the glyph_pixel in the alpha channel which is byte 2
                                ((unsigned char*)(&dst[dst_index]))[0] = 255;
                                ((unsigned char*)(&dst[dst_index]))[1] = glyph_pixel;
                            }
                        }

                        // Fill chars rectangles in atlas info
                        glyphs[i].x = (float)offset_x;
                        glyphs[i].y = (float)offset_y;

                        // Move atlas position X for next character drawing
                        offset_x += (glyphs[i].width + 2 * padding);
                        if (offset_x >= (atlas_width - glyphs[i].width - 2 * padding))
                        {
                            offset_x  = padding;
                            offset_y += font_info->font_size + padding;

                            if (offset_y > (atlas_width - font_info->font_size - padding)) break;
                            //else error dst buffer is not big enough
                        }
                    }
                }
                RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

                result.data   = dst;
                result.width  = atlas_width;
                result.height = atlas_width;
                result.format = RF_UNCOMPRESSED_GRAY_ALPHA;
                result.valid  = true;
            }

            RF_FREE(temp_allocator, glyph_buffer);
        }
    }

    return result;
}